

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O0

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this)

{
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_local;
  
  internal::
  LU_GlobalLU_t<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
  ~LU_GlobalLU_t(&this->m_glu);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&this->m_etree);
  PermutationMatrix<-1,_-1,_int>::~PermutationMatrix(&this->m_perm_r);
  PermutationMatrix<-1,_-1,_int>::~PermutationMatrix(&this->m_perm_c);
  MappedSparseMatrix<double,_0,_int>::~MappedSparseMatrix(&this->m_Ustore);
  internal::MappedSuperNodalMatrix<double,_int>::~MappedSuperNodalMatrix(&this->m_Lstore);
  SparseMatrix<double,_0,_int>::~SparseMatrix(&this->m_mat);
  std::__cxx11::string::~string((string *)&this->m_lastError);
  return;
}

Assistant:

~SparseLU()
    {
      // Free all explicit dynamic pointers 
    }